

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreencommon.cpp
# Opt level: O2

void __thiscall
QOffscreenBackingStore::flush
          (QOffscreenBackingStore *this,QWindow *window,QRegion *region,QPoint *offset)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  QRect *pQVar5;
  QOffscreenBackingStore **ppQVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  WId id;
  QRegion clipped;
  QPoint local_68;
  QRect local_60;
  QRect local_50;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = QImage::size();
  if (0 < (int)((ulong)uVar4 >> 0x20) && 0 < (int)uVar4) {
    uVar4 = QImage::size();
    local_40 = 0xaaaaaaaaaaaaaaaa;
    iVar2 = QWindow::width(window);
    iVar3 = QWindow::height(window);
    auVar1._4_4_ = iVar3 + -1;
    auVar1._0_4_ = iVar2 + -1;
    auVar1._8_8_ = 0;
    local_50 = (QRect)(auVar1 << 0x40);
    QRegion::QRegion((QRegion *)&local_40,&local_50,0);
    local_60.x1.m_i = 0;
    local_60.y1.m_i = 0;
    local_60.x2.m_i = (int)uVar4 + -1;
    local_60.y2.m_i = (int)((ulong)uVar4 >> 0x20) + -1;
    local_68.yp.m_i = -(offset->yp).m_i;
    local_68.xp.m_i = -(offset->xp).m_i;
    local_50 = QRect::translated(&local_60,&local_68);
    QRegion::operator&=((QRegion *)&local_40,&local_50);
    local_50 = (QRect)QRegion::boundingRect();
    QVar7 = QRect::translated(&local_50,offset);
    if ((QVar7.x1.m_i.m_i + -1 != QVar7.x2.m_i.m_i) || (QVar7.y1.m_i.m_i + -1 != QVar7.y2.m_i.m_i))
    {
      uVar4 = QWindow::winId();
      local_50.x1.m_i = (int)uVar4;
      local_50.y1.m_i = (int)((ulong)uVar4 >> 0x20);
      pQVar5 = QHash<unsigned_long_long,_QRect>::operator[]
                         (&this->m_windowAreaHash,(unsigned_long_long *)&local_50);
      *pQVar5 = QVar7;
      ppQVar6 = QHash<unsigned_long_long,_QOffscreenBackingStore_*>::operator[]
                          (&m_backingStoreForWinIdHash,(unsigned_long_long *)&local_50);
      *ppQVar6 = this;
    }
    QRegion::~QRegion((QRegion *)&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOffscreenBackingStore::flush(QWindow *window, const QRegion &region, const QPoint &offset)
{
    Q_UNUSED(region);

    if (m_image.size().isEmpty())
        return;

    QSize imageSize = m_image.size();

    QRegion clipped = QRect(0, 0, window->width(), window->height());
    clipped &= QRect(0, 0, imageSize.width(), imageSize.height()).translated(-offset);

    QRect bounds = clipped.boundingRect().translated(offset);

    if (bounds.isNull())
        return;

    WId id = window->winId();

    m_windowAreaHash[id] = bounds;
    m_backingStoreForWinIdHash[id] = this;
}